

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O3

void xml_print_node(lyout *out,int level,lyd_node *node,int toplevel,int options)

{
  LYS_NODE LVar1;
  int iVar2;
  lys_module *plVar3;
  LY_ERR *pLVar4;
  ulong uVar5;
  char *pcVar6;
  lys_node *node_00;
  ulong uVar7;
  lyd_node *plVar8;
  char *local_48;
  lyd_node *local_40;
  ulong local_38;
  
  uVar7 = (ulong)(uint)level;
  iVar2 = lyd_wd_toprint(node,options);
  if (iVar2 == 0) {
    return;
  }
  LVar1 = node->schema->nodetype;
  local_40 = node;
  local_38 = uVar7;
  if ((int)LVar1 < 0x20) {
    if (7 < (int)LVar1) {
      if (LVar1 == LYS_LEAFLIST) goto LAB_0017f47b;
      if (LVar1 != LYS_LIST) goto LAB_0017f549;
      if (toplevel == 0) {
        if ((node->parent == (lyd_node *)0x0) || (iVar2 = nscmp(node,node->parent), iVar2 != 0)) {
          plVar3 = lyd_node_module(node);
          uVar5 = (ulong)(level * 2 - 2);
          if (level == 0) {
            uVar5 = uVar7;
          }
          ly_print(out,"%*s<%s xmlns=\"%s\"",uVar5,"",node->schema->name,plVar3->ns);
        }
        else {
          uVar5 = (ulong)(level * 2 - 2);
          if (level == 0) {
            uVar5 = uVar7;
          }
          ly_print(out,"%*s<%s",uVar5,"",node->schema->name);
        }
      }
      else {
        plVar3 = lyd_node_module(node);
        uVar5 = (ulong)(level * 2 - 2);
        if (level == 0) {
          uVar5 = uVar7;
        }
        ly_print(out,"%*s<%s xmlns=\"%s\"",uVar5,"",node->schema->name,plVar3->ns);
        xml_print_ns(out,node,options);
      }
      xml_print_attrs(out,node,options);
      pcVar6 = "\n";
      if (level == 0) {
        pcVar6 = "";
      }
      if (node->child == (lyd_node *)0x0) goto LAB_0017f9b3;
      ly_print(out,">%s",pcVar6);
      plVar8 = node->child;
      if (plVar8 != (lyd_node *)0x0) {
        uVar7 = (ulong)((int)local_38 + 1);
        if ((int)local_38 == 0) {
          uVar7 = local_38 & 0xffffffff;
        }
        do {
          xml_print_node(out,(int)uVar7,plVar8,0,options);
          plVar8 = plVar8->next;
        } while (plVar8 != (lyd_node *)0x0);
      }
      goto LAB_0017f6d3;
    }
    if (LVar1 != LYS_CONTAINER) {
      if (LVar1 != LYS_LEAF) {
LAB_0017f549:
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
               ,0x22b);
        return;
      }
LAB_0017f47b:
      xml_print_leaf(out,level,node,toplevel,options);
      return;
    }
  }
  else if ((int)LVar1 < 0x100) {
    if (LVar1 == LYS_ANYXML) {
LAB_0017f49d:
      if (toplevel == 0) {
        if ((node->parent == (lyd_node *)0x0) || (iVar2 = nscmp(node,node->parent), iVar2 != 0)) {
          plVar3 = lyd_node_module(node);
          uVar5 = (ulong)(level * 2 - 2);
          if (level == 0) {
            uVar5 = uVar7;
          }
          ly_print(out,"%*s<%s xmlns=\"%s\"",uVar5,"",node->schema->name,plVar3->ns);
        }
        else {
          uVar5 = (ulong)(level * 2 - 2);
          if (level == 0) {
            uVar5 = uVar7;
          }
          ly_print(out,"%*s<%s",uVar5,"",node->schema->name);
        }
      }
      else {
        plVar3 = lyd_node_module(node);
        uVar5 = (ulong)(level * 2 - 2);
        if (level == 0) {
          uVar5 = uVar7;
        }
        ly_print(out,"%*s<%s xmlns=\"%s\"",uVar5,"",node->schema->name,plVar3->ns);
        xml_print_ns(out,node,options);
      }
      xml_print_attrs(out,node,options);
      if ((node[1].schema == (lys_node *)0x0) ||
         ((*(int *)&node->child == 0 && (*(char *)&(node[1].schema)->name == '\0')))) {
        pcVar6 = "\n";
        if (level == 0) {
          pcVar6 = "";
        }
        ly_print(out,"/>%s",pcVar6);
        return;
      }
      ly_print(out,">");
      switch(*(undefined4 *)&node->child) {
      case 0:
        lyxml_dump_text(out,(char *)node[1].schema);
        break;
      case 1:
      case 3:
      case 5:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                      ,0x206,
                      "void xml_print_anydata(struct lyout *, int, const struct lyd_node *, int, int)"
                     );
      case 2:
        if ('\0' < ly_log_level) {
          ly_log(LY_LLWRN,"Unable to print anydata content (type %d) as XML.",2);
        }
        break;
      case 4:
        ly_print(out,"%s",node[1].schema);
        break;
      case 8:
        iVar2 = 0x32;
        if ((int)local_38 == 0) {
          iVar2 = 0x10;
        }
        pcVar6 = "\n";
        if ((int)local_38 == 0) {
          pcVar6 = "";
        }
        lyxml_print_mem(&local_48,(lyxml_elem *)node[1].schema,iVar2);
        ly_print(out,"%s%s",pcVar6,local_48);
        free(local_48);
        break;
      case 0x10:
        node_00 = node[1].schema;
        if (node_00 != (lys_node *)0x0) {
          if ((int)local_38 != 0) {
            ly_print(out,"\n");
            node_00 = node[1].schema;
            if (node_00 == (lys_node *)0x0) break;
          }
          iVar2 = (int)local_38 + 1;
          if ((int)local_38 == 0) {
            iVar2 = 0;
          }
          do {
            xml_print_node(out,iVar2,(lyd_node *)node_00,0,options & 0xfffffefe);
            node_00 = *(lys_node **)&node_00->flags;
          } while (node_00 != (lys_node *)0x0);
        }
      }
      pcVar6 = "\n";
      if ((int)local_38 == 0) {
        pcVar6 = "";
      }
      ly_print(out,"</%s>%s",node->schema->name,pcVar6);
      return;
    }
    if (LVar1 != LYS_NOTIF) goto LAB_0017f549;
  }
  else if (LVar1 != LYS_RPC) {
    if (LVar1 == LYS_ANYDATA) goto LAB_0017f49d;
    if (LVar1 != LYS_ACTION) goto LAB_0017f549;
  }
  if (toplevel == 0) {
    if ((node->parent == (lyd_node *)0x0) || (iVar2 = nscmp(node,node->parent), iVar2 != 0)) {
      plVar3 = lyd_node_module(node);
      uVar5 = (ulong)(level * 2 - 2);
      if (level == 0) {
        uVar5 = uVar7;
      }
      ly_print(out,"%*s<%s xmlns=\"%s\"",uVar5,"",node->schema->name,plVar3->ns);
    }
    else {
      uVar5 = (ulong)(level * 2 - 2);
      if (level == 0) {
        uVar5 = uVar7;
      }
      ly_print(out,"%*s<%s",uVar5,"",node->schema->name);
    }
  }
  else {
    plVar3 = lyd_node_module(node);
    uVar5 = (ulong)(level * 2 - 2);
    if (level == 0) {
      uVar5 = uVar7;
    }
    ly_print(out,"%*s<%s xmlns=\"%s\"",uVar5,"",node->schema->name,plVar3->ns);
    xml_print_ns(out,node,options);
  }
  xml_print_attrs(out,node,options);
  pcVar6 = "\n";
  if (level == 0) {
    pcVar6 = "";
  }
  if (node->child == (lyd_node *)0x0) {
LAB_0017f9b3:
    ly_print(out,"/>%s",pcVar6);
    return;
  }
  ly_print(out,">%s",pcVar6);
  plVar8 = node->child;
  if (plVar8 != (lyd_node *)0x0) {
    uVar7 = (ulong)((int)local_38 + 1);
    if ((int)local_38 == 0) {
      uVar7 = local_38 & 0xffffffff;
    }
    do {
      xml_print_node(out,(int)uVar7,plVar8,0,options);
      plVar8 = plVar8->next;
    } while (plVar8 != (lyd_node *)0x0);
  }
LAB_0017f6d3:
  uVar7 = (ulong)((int)local_38 * 2 - 2);
  if ((int)local_38 == 0) {
    uVar7 = local_38 & 0xffffffff;
  }
  ly_print(out,"%*s</%s>%s",uVar7,"",local_40->schema->name,pcVar6);
  return;
}

Assistant:

void
xml_print_node(struct lyout *out, int level, const struct lyd_node *node, int toplevel, int options)
{
    if (!lyd_wd_toprint(node, options)) {
        return;
    }

    switch (node->schema->nodetype) {
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_CONTAINER:
        xml_print_container(out, level, node, toplevel, options);
        break;
    case LYS_LEAF:
        xml_print_leaf(out, level, node, toplevel, options);
        break;
    case LYS_LEAFLIST:
        xml_print_list(out, level, node, 0, toplevel, options);
        break;
    case LYS_LIST:
        xml_print_list(out, level, node, 1, toplevel, options);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        xml_print_anydata(out, level, node, toplevel, options);
        break;
    default:
        LOGINT;
        break;
    }
}